

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::UncommittedDepthStencil
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  glUseProgramFunc p_Var1;
  undefined *puVar2;
  Functions *gl_00;
  bool bVar3;
  deUint32 dVar4;
  GLenum GVar5;
  ostream *poVar6;
  ShaderInfo *pSVar7;
  char *pcVar8;
  ContextInfo *this_00;
  bool local_32a;
  bool local_31b;
  bool local_319;
  ProgramSources local_248;
  undefined1 local_178 [8];
  ShaderProgram program;
  undefined1 local_a0 [8];
  string fragmentSource;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string vertexSource;
  GLuint widthCommitted;
  GLint depth;
  GLint height;
  GLint width;
  bool result;
  GLuint *pGStack_30;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  UncommittedRegionsAccessTestCase *this_local;
  
  width = level;
  pGStack_30 = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  bVar3 = depthStencilAllowed(this,target,format);
  if (bVar3) {
    std::operator<<((ostream *)
                    &(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.field_0x88,"Depth Stencil - ");
    height._3_1_ = 1;
    SparseTextureUtils::getTextureLevelSize
              (texture_local._4_4_,
               &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .mState,width,&depth,(GLint *)&widthCommitted,
               (GLint *)(vertexSource.field_2._M_local_buf + 0xc));
    puVar2 = st2_vertex_drawBuffer;
    vertexSource.field_2._8_4_ = depth / 2;
    if (((vertexSource.field_2._8_4_ == 0) || (widthCommitted == 0)) ||
       ((int)vertexSource.field_2._12_4_ <
        (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        minDepth)) {
      this_local._7_1_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_68,puVar2,&local_69);
      std::allocator<char>::~allocator(&local_69);
      puVar2 = st2_fragment_drawBuffer;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,puVar2,
                 (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
      gl_00 = _format_local;
      glu::makeVtxFragSources(&local_248,(string *)local_68,(string *)local_a0);
      glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_178,gl_00,&local_248);
      glu::ProgramSources::~ProgramSources(&local_248);
      bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_178);
      if (bVar3) {
        prepareDepthStencilFramebuffer(this,_format_local,depth,widthCommitted);
        p_Var1 = _format_local->useProgram;
        dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_178);
        (*p_Var1)(dVar4);
        (*_format_local->activeTexture)(0x84c0);
        GVar5 = (*_format_local->getError)();
        glu::checkError(GVar5,"glActiveTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x621);
        gl4cts::Texture::Bind(_format_local,*pGStack_30,texture_local._4_4_);
        (*_format_local->uniform1i)(1,0);
        GVar5 = (*_format_local->getError)();
        glu::checkError(GVar5,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x624);
        local_319 = false;
        if ((height._3_1_ & 1) != 0) {
          local_319 = verifyStencilTest(this,_format_local,(ShaderProgram *)local_178,depth,
                                        widthCommitted,vertexSource.field_2._8_4_);
        }
        height._3_1_ = local_319;
        local_31b = false;
        if (local_319 != false) {
          local_31b = verifyDepthTest(this,_format_local,(ShaderProgram *)local_178,depth,
                                      widthCommitted,vertexSource.field_2._8_4_);
        }
        height._3_1_ = local_31b;
        this_00 = deqp::Context::getContextInfo
                            ((this->super_SparseTexture2CommitmentTestCase).
                             super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
        bVar3 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_depth_bounds_test");
        if (bVar3) {
          local_32a = false;
          if ((height._3_1_ & 1) != 0) {
            local_32a = verifyDepthBoundsTest
                                  (this,_format_local,(ShaderProgram *)local_178,depth,
                                   widthCommitted,vertexSource.field_2._8_4_);
          }
          height._3_1_ = local_32a;
        }
        cleanupDepthStencilFramebuffer(this,_format_local);
        this_local._7_1_ = height._3_1_ & 1;
      }
      else {
        poVar6 = std::operator<<((ostream *)
                                 &(this->super_SparseTexture2CommitmentTestCase).
                                  super_SparseTextureCommitmentTestCase.field_0x88,
                                 "Shader compilation failed (depth_stencil) for target: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,texture_local._4_4_);
        poVar6 = std::operator<<(poVar6,", format: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(GLint)texture_local);
        poVar6 = std::operator<<(poVar6,", vertex_infoLog: ");
        pSVar7 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_178,SHADERTYPE_VERTEX,0);
        poVar6 = std::operator<<(poVar6,(string *)&pSVar7->infoLog);
        poVar6 = std::operator<<(poVar6,", fragment_infoLog: ");
        pSVar7 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_178,SHADERTYPE_FRAGMENT,0)
        ;
        poVar6 = std::operator<<(poVar6,(string *)&pSVar7->infoLog);
        poVar6 = std::operator<<(poVar6,", vertexSource: ");
        pcVar8 = (char *)std::__cxx11::string::c_str();
        poVar6 = std::operator<<(poVar6,pcVar8);
        poVar6 = std::operator<<(poVar6,"\n");
        poVar6 = std::operator<<(poVar6,", fragmentSource: ");
        pcVar8 = (char *)std::__cxx11::string::c_str();
        poVar6 = std::operator<<(poVar6,pcVar8);
        std::operator<<(poVar6," - ");
        this_local._7_1_ = 0;
      }
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_178);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool UncommittedRegionsAccessTestCase::UncommittedDepthStencil(const Functions& gl, GLint target, GLint format,
															   GLuint& texture, GLint level)
{
	if (!depthStencilAllowed(target, format))
		return true;

	mLog << "Depth Stencil - ";

	bool result = true;

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLuint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	//Prepare shaders
	std::string vertexSource   = st2_vertex_drawBuffer;
	std::string fragmentSource = st2_fragment_drawBuffer;

	ShaderProgram program(gl, glu::makeVtxFragSources(vertexSource, fragmentSource));
	if (!program.isOk())
	{
		mLog << "Shader compilation failed (depth_stencil) for target: " << target << ", format: " << format
			 << ", vertex_infoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
			 << ", fragment_infoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
			 << ", vertexSource: " << vertexSource.c_str() << "\n"
			 << ", fragmentSource: " << fragmentSource.c_str() << " - ";

		return false;
	}

	prepareDepthStencilFramebuffer(gl, width, height);

	gl.useProgram(program.getProgram());

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
	Texture::Bind(gl, texture, target);
	gl.uniform1i(1, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

	// Stencil test
	result = result && verifyStencilTest(gl, program, width, height, widthCommitted);

	// Depth test
	result = result && verifyDepthTest(gl, program, width, height, widthCommitted);

	// Depth bounds test
	if (m_context.getContextInfo().isExtensionSupported("GL_EXT_depth_bounds_test"))
		result = result && verifyDepthBoundsTest(gl, program, width, height, widthCommitted);

	// Resources cleaning
	cleanupDepthStencilFramebuffer(gl);

	return result;
}